

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O0

YSRESULT __thiscall YsSoundPlayer::APISpecificData::Start(APISpecificData *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  snd_pcm_t *psVar4;
  snd_pcm_hw_params_t *psVar5;
  snd_pcm_uframes_t sVar6;
  int iVar7;
  long lVar8;
  size_t __n;
  uchar *puVar9;
  uint *puVar10;
  snd_pcm_uframes_t *psVar11;
  undefined8 uStack_50;
  snd_pcm_hw_params_t asStack_48 [8];
  uchar *local_40;
  snd_pcm_hw_params_t *local_38;
  APISpecificData *local_30;
  uint local_28;
  undefined1 local_24 [4];
  int i;
  int dir;
  uint request;
  int res;
  APISpecificData *this_local;
  
  uStack_50 = 0x11f40b;
  local_30 = this;
  _request = this;
  dir = snd_pcm_open(&this->handle,"default",0,1);
  if (dir < 0) {
    uStack_50 = 0x11f423;
    printf("Cannot open PCM device.\n");
    local_30->handle = (snd_pcm_t *)0x0;
    this_local._4_4_ = YSERR;
  }
  else {
    uStack_50 = 0x11f442;
    lVar8 = snd_pcm_hw_params_sizeof();
    lVar8 = -(lVar8 + 0xfU & 0xfffffffffffffff0);
    local_30->hwParam = asStack_48 + lVar8;
    local_38 = local_30->hwParam;
    *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f46b;
    __n = snd_pcm_hw_params_sizeof();
    psVar5 = local_38;
    *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f479;
    memset(psVar5,0,__n);
    psVar4 = local_30->handle;
    psVar5 = local_30->hwParam;
    *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f48a;
    snd_pcm_hw_params_any(psVar4,psVar5);
    psVar4 = local_30->handle;
    psVar5 = local_30->hwParam;
    *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f4a0;
    snd_pcm_hw_params_set_access(psVar4,psVar5,3);
    psVar4 = local_30->handle;
    psVar5 = local_30->hwParam;
    *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f4b6;
    snd_pcm_hw_params_set_format(psVar4,psVar5,2);
    psVar4 = local_30->handle;
    psVar5 = local_30->hwParam;
    *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f4cc;
    snd_pcm_hw_params_set_channels(psVar4,psVar5,1);
    i = 8000;
    psVar4 = local_30->handle;
    psVar5 = local_30->hwParam;
    *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f4ec;
    snd_pcm_hw_params_set_rate_near(psVar4,psVar5,&i,local_24);
    psVar4 = local_30->handle;
    psVar5 = local_30->hwParam;
    *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f4fd;
    iVar7 = snd_pcm_hw_params(psVar4,psVar5);
    if (iVar7 < 0) {
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f513;
      printf("Cannot set hardward parameters.\n");
      this_local._4_4_ = YSERR;
    }
    else {
      psVar5 = local_30->hwParam;
      puVar10 = &local_30->nChannel;
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f530;
      snd_pcm_hw_params_get_channels(psVar5,puVar10);
      psVar5 = local_30->hwParam;
      puVar10 = &local_30->rate;
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f545;
      snd_pcm_hw_params_get_rate(psVar5,puVar10,local_24);
      psVar5 = local_30->hwParam;
      psVar11 = &local_30->nPeriod;
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f55a;
      snd_pcm_hw_params_get_period_size(psVar5,psVar11,local_24);
      psVar5 = local_30->hwParam;
      puVar10 = &local_30->bufSize;
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f56b;
      snd_pcm_hw_params_get_buffer_size(psVar5,puVar10);
      uVar1 = local_30->nChannel;
      uVar2 = local_30->rate;
      sVar6 = local_30->nPeriod;
      uVar3 = local_30->bufSize;
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f58b;
      printf("%d channels, %d Hz, %d periods, %d frames buffer.\n",(ulong)uVar1,(ulong)uVar2,sVar6,
             (ulong)uVar3);
      local_30->bufSizeInNStep = (uint)(local_30->nPeriod << 2);
      local_30->bufSizeInByte = local_30->bufSizeInNStep * local_30->bytePerTimeStep;
      if ((local_30->writeBuf != (uchar *)0x0) &&
         (puVar9 = local_30->writeBuf, local_40 = puVar9, puVar9 != (uchar *)0x0)) {
        *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f5c7;
        operator_delete__(puVar9);
      }
      uVar1 = local_30->bufSizeInByte;
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f5d7;
      puVar9 = (uchar *)operator_new__((ulong)uVar1);
      local_30->writeBuf = puVar9;
      for (local_28 = 0; local_28 < local_30->bufSizeInByte; local_28 = local_28 + 1) {
        local_30->writeBuf[(int)local_28] = '\0';
      }
      psVar4 = local_30->handle;
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f61d;
      snd_pcm_prepare(psVar4);
      psVar4 = local_30->handle;
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f62f;
      iVar7 = snd_pcm_wait(psVar4,1000);
      if (iVar7 == 0) {
        *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f645;
        printf("snd_pcm_wait timed out.\n");
        *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f653;
        printf("There may be no sound.\n");
      }
      psVar4 = local_30->handle;
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f660;
      snd_pcm_start(psVar4);
      *(undefined8 *)(asStack_48 + lVar8 + -8) = 0x11f66e;
      printf("YsSoundPlayer started.\n");
      this_local._4_4_ = YSOK;
    }
  }
  return this_local._4_4_;
}

Assistant:

YSRESULT YsSoundPlayer::APISpecificData::Start(void)
{
	int res=snd_pcm_open(&handle,"default",SND_PCM_STREAM_PLAYBACK,SND_PCM_NONBLOCK);
	if(0>res)
	{
		printf("Cannot open PCM device.\n");
		handle=nullptr;
		return YSERR;
	}

	snd_pcm_hw_params_alloca(&hwParam);
	snd_pcm_hw_params_any(handle,hwParam);
	snd_pcm_hw_params_set_access(handle,hwParam,SND_PCM_ACCESS_RW_INTERLEAVED);
	snd_pcm_hw_params_set_format(handle,hwParam,SND_PCM_FORMAT_S16_LE);
	snd_pcm_hw_params_set_channels(handle,hwParam,1);

	unsigned int request=8000;//22050;
	int dir;  // What's dir?
	snd_pcm_hw_params_set_rate_near(handle,hwParam,&request,&dir);

	if(0>snd_pcm_hw_params(handle,hwParam))
	{
		printf("Cannot set hardward parameters.\n");
		return YSERR;
	}

	snd_pcm_hw_params_get_channels(hwParam,&nChannel);
	snd_pcm_hw_params_get_rate(hwParam,&rate,&dir);
	snd_pcm_hw_params_get_period_size(hwParam,&nPeriod,&dir);
	snd_pcm_hw_params_get_buffer_size(hwParam,(snd_pcm_uframes_t *)&bufSize);
	printf("%d channels, %d Hz, %d periods, %d frames buffer.\n",
		   nChannel,rate,(int)nPeriod,(int)bufSize);

	bufSizeInNStep=nPeriod*4;
	bufSizeInByte=bufSizeInNStep*bytePerTimeStep;
	if(nullptr!=writeBuf)
	{
		delete [] writeBuf;
	}
	writeBuf=new unsigned char [bufSizeInByte];
	for(int i=0; i<bufSizeInByte; ++i)
	{
		writeBuf[i]=0;
	}

	// snd_pcm_sw_params_alloca(&swParam);
	// snd_async_add_pcm_handler(&asyncHandler,handle,KeepPlayingCallBack,this);


	snd_pcm_prepare(handle);
	if(0==snd_pcm_wait(handle,1000))
	{
		printf("snd_pcm_wait timed out.\n");
		printf("There may be no sound.\n");
	}
	snd_pcm_start(handle);

	printf("YsSoundPlayer started.\n");

	return YSOK;
}